

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QLoggingCategory_*,_QtMsgType> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::insert
          (Span<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *this,size_t i)

{
  byte bVar1;
  uchar *puVar2;
  Node<QLoggingCategory_*,_QtMsgType> *pNVar3;
  long in_RSI;
  long in_RDI;
  Span<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *unaff_retaddr;
  uchar entry;
  
  if (*(char *)(in_RDI + 0x89) == *(char *)(in_RDI + 0x88)) {
    addStorage(unaff_retaddr);
  }
  bVar1 = *(byte *)(in_RDI + 0x89);
  puVar2 = Entry::nextFree((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 0x10));
  *(uchar *)(in_RDI + 0x89) = *puVar2;
  *(byte *)(in_RDI + in_RSI) = bVar1;
  pNVar3 = Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 0x10));
  return pNVar3;
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }